

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O1

void __thiscall
format::mtx_arith_error::mtx_arith_error
          (mtx_arith_error *this,string *expected_arith,string *got_arith,string *filename,
          string *msg)

{
  pointer pcVar1;
  string local_70;
  string local_50;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + filename->_M_string_length);
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + msg->_M_string_length);
  mtx_error::mtx_error(&this->super_mtx_error,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_arith_error_00160710;
  (this->expected_arith_)._M_dataplus._M_p = (pointer)&(this->expected_arith_).field_2;
  (this->expected_arith_)._M_string_length = 0;
  (this->expected_arith_).field_2._M_local_buf[0] = '\0';
  (this->got_arith_)._M_dataplus._M_p = (pointer)&(this->got_arith_).field_2;
  (this->got_arith_)._M_string_length = 0;
  (this->got_arith_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->expected_arith_);
  std::__cxx11::string::_M_assign((string *)&this->got_arith_);
  return;
}

Assistant:

mtx_arith_error
  (
    std::string expected_arith,
    std::string got_arith,
    std::string filename="Unknown",
    std::string msg="Matrix arithmetic mismatch"
  )
  : mtx_error(filename, msg)
  {
   expected_arith_ = expected_arith;
   got_arith_ = got_arith;
  }